

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImGui::GetStyleColorName(ImGuiCol idx)

{
  ImGuiCol idx_local;
  char *local_8;
  
  switch(idx) {
  case 0:
    local_8 = "Text";
    break;
  case 1:
    local_8 = "TextDisabled";
    break;
  case 2:
    local_8 = "WindowBg";
    break;
  case 3:
    local_8 = "ChildBg";
    break;
  case 4:
    local_8 = "PopupBg";
    break;
  case 5:
    local_8 = "Border";
    break;
  case 6:
    local_8 = "BorderShadow";
    break;
  case 7:
    local_8 = "FrameBg";
    break;
  case 8:
    local_8 = "FrameBgHovered";
    break;
  case 9:
    local_8 = "FrameBgActive";
    break;
  case 10:
    local_8 = "TitleBg";
    break;
  case 0xb:
    local_8 = "TitleBgActive";
    break;
  case 0xc:
    local_8 = "TitleBgCollapsed";
    break;
  case 0xd:
    local_8 = "MenuBarBg";
    break;
  case 0xe:
    local_8 = "ScrollbarBg";
    break;
  case 0xf:
    local_8 = "ScrollbarGrab";
    break;
  case 0x10:
    local_8 = "ScrollbarGrabHovered";
    break;
  case 0x11:
    local_8 = "ScrollbarGrabActive";
    break;
  case 0x12:
    local_8 = "CheckMark";
    break;
  case 0x13:
    local_8 = "SliderGrab";
    break;
  case 0x14:
    local_8 = "SliderGrabActive";
    break;
  case 0x15:
    local_8 = "Button";
    break;
  case 0x16:
    local_8 = "ButtonHovered";
    break;
  case 0x17:
    local_8 = "ButtonActive";
    break;
  case 0x18:
    local_8 = "Header";
    break;
  case 0x19:
    local_8 = "HeaderHovered";
    break;
  case 0x1a:
    local_8 = "HeaderActive";
    break;
  case 0x1b:
    local_8 = "Separator";
    break;
  case 0x1c:
    local_8 = "SeparatorHovered";
    break;
  case 0x1d:
    local_8 = "SeparatorActive";
    break;
  case 0x1e:
    local_8 = "ResizeGrip";
    break;
  case 0x1f:
    local_8 = "ResizeGripHovered";
    break;
  case 0x20:
    local_8 = "ResizeGripActive";
    break;
  case 0x21:
    local_8 = "Tab";
    break;
  case 0x22:
    local_8 = "TabHovered";
    break;
  case 0x23:
    local_8 = "TabActive";
    break;
  case 0x24:
    local_8 = "TabUnfocused";
    break;
  case 0x25:
    local_8 = "TabUnfocusedActive";
    break;
  case 0x26:
    local_8 = "DockingPreview";
    break;
  case 0x27:
    local_8 = "DockingEmptyBg";
    break;
  case 0x28:
    local_8 = "PlotLines";
    break;
  case 0x29:
    local_8 = "PlotLinesHovered";
    break;
  case 0x2a:
    local_8 = "PlotHistogram";
    break;
  case 0x2b:
    local_8 = "PlotHistogramHovered";
    break;
  case 0x2c:
    local_8 = "TextSelectedBg";
    break;
  case 0x2d:
    local_8 = "DragDropTarget";
    break;
  case 0x2e:
    local_8 = "NavHighlight";
    break;
  case 0x2f:
    local_8 = "NavWindowingHighlight";
    break;
  case 0x30:
    local_8 = "NavWindowingDimBg";
    break;
  case 0x31:
    local_8 = "ModalWindowDimBg";
    break;
  default:
    local_8 = "Unknown";
  }
  return local_8;
}

Assistant:

const char* ImGui::GetStyleColorName(ImGuiCol idx)
{
    // Create switch-case from enum with regexp: ImGuiCol_{.*}, --> case ImGuiCol_\1: return "\1";
    switch (idx)
    {
    case ImGuiCol_Text: return "Text";
    case ImGuiCol_TextDisabled: return "TextDisabled";
    case ImGuiCol_WindowBg: return "WindowBg";
    case ImGuiCol_ChildBg: return "ChildBg";
    case ImGuiCol_PopupBg: return "PopupBg";
    case ImGuiCol_Border: return "Border";
    case ImGuiCol_BorderShadow: return "BorderShadow";
    case ImGuiCol_FrameBg: return "FrameBg";
    case ImGuiCol_FrameBgHovered: return "FrameBgHovered";
    case ImGuiCol_FrameBgActive: return "FrameBgActive";
    case ImGuiCol_TitleBg: return "TitleBg";
    case ImGuiCol_TitleBgActive: return "TitleBgActive";
    case ImGuiCol_TitleBgCollapsed: return "TitleBgCollapsed";
    case ImGuiCol_MenuBarBg: return "MenuBarBg";
    case ImGuiCol_ScrollbarBg: return "ScrollbarBg";
    case ImGuiCol_ScrollbarGrab: return "ScrollbarGrab";
    case ImGuiCol_ScrollbarGrabHovered: return "ScrollbarGrabHovered";
    case ImGuiCol_ScrollbarGrabActive: return "ScrollbarGrabActive";
    case ImGuiCol_CheckMark: return "CheckMark";
    case ImGuiCol_SliderGrab: return "SliderGrab";
    case ImGuiCol_SliderGrabActive: return "SliderGrabActive";
    case ImGuiCol_Button: return "Button";
    case ImGuiCol_ButtonHovered: return "ButtonHovered";
    case ImGuiCol_ButtonActive: return "ButtonActive";
    case ImGuiCol_Header: return "Header";
    case ImGuiCol_HeaderHovered: return "HeaderHovered";
    case ImGuiCol_HeaderActive: return "HeaderActive";
    case ImGuiCol_Separator: return "Separator";
    case ImGuiCol_SeparatorHovered: return "SeparatorHovered";
    case ImGuiCol_SeparatorActive: return "SeparatorActive";
    case ImGuiCol_ResizeGrip: return "ResizeGrip";
    case ImGuiCol_ResizeGripHovered: return "ResizeGripHovered";
    case ImGuiCol_ResizeGripActive: return "ResizeGripActive";
    case ImGuiCol_Tab: return "Tab";
    case ImGuiCol_TabHovered: return "TabHovered";
    case ImGuiCol_TabActive: return "TabActive";
    case ImGuiCol_TabUnfocused: return "TabUnfocused";
    case ImGuiCol_TabUnfocusedActive: return "TabUnfocusedActive";
    case ImGuiCol_DockingPreview: return "DockingPreview";
    case ImGuiCol_DockingEmptyBg: return "DockingEmptyBg";
    case ImGuiCol_PlotLines: return "PlotLines";
    case ImGuiCol_PlotLinesHovered: return "PlotLinesHovered";
    case ImGuiCol_PlotHistogram: return "PlotHistogram";
    case ImGuiCol_PlotHistogramHovered: return "PlotHistogramHovered";
    case ImGuiCol_TextSelectedBg: return "TextSelectedBg";
    case ImGuiCol_DragDropTarget: return "DragDropTarget";
    case ImGuiCol_NavHighlight: return "NavHighlight";
    case ImGuiCol_NavWindowingHighlight: return "NavWindowingHighlight";
    case ImGuiCol_NavWindowingDimBg: return "NavWindowingDimBg";
    case ImGuiCol_ModalWindowDimBg: return "ModalWindowDimBg";
    }
    IM_ASSERT(0);
    return "Unknown";
}